

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
deqp::gles31::Functional::getScalarSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          *symbols)

{
  int iVar1;
  pointer pSVar2;
  long lVar3;
  long lVar4;
  allocator_type local_21;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_21)
  ;
  pSVar2 = (symbols->
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(symbols->
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) >> 3) *
          -0x49249249) {
    lVar4 = 0x20;
    lVar3 = 0;
    do {
      iVar1 = glu::VarType::getScalarSize
                        ((VarType *)((long)&(pSVar2->name)._M_dataplus._M_p + lVar4));
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar3] = iVar1;
      lVar3 = lVar3 + 1;
      pSVar2 = (symbols->
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x38;
    } while (lVar3 < (int)((ulong)((long)(symbols->
                                         super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2)
                          >> 3) * -0x49249249);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<int> getScalarSizes (const vector<Symbol>& symbols)
{
	vector<int> sizes(symbols.size());
	for (int ndx = 0; ndx < (int)symbols.size(); ++ndx)
		sizes[ndx] = symbols[ndx].varType.getScalarSize();
	return sizes;
}